

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O0

void ssh1mainchan_send_terminal_size_change(SshChannel *sc,int w,int h)

{
  PktOut *pPVar1;
  PktOut *pktout;
  ssh1_connection_state *s;
  int h_local;
  int w_local;
  SshChannel *sc_local;
  
  pPVar1 = ssh_bpp_new_pktout((BinaryPacketProtocol *)sc[0xd].cl,0xb);
  BinarySink_put_uint32(pPVar1->binarysink_,(long)h);
  BinarySink_put_uint32(pPVar1->binarysink_,(long)w);
  BinarySink_put_uint32(pPVar1->binarysink_,0);
  BinarySink_put_uint32(pPVar1->binarysink_,0);
  pq_base_push((PacketQueueBase *)sc[0xe].cl,&pPVar1->qnode);
  return;
}

Assistant:

static void ssh1mainchan_send_terminal_size_change(
    SshChannel *sc, int w, int h)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_CMSG_WINDOW_SIZE);
    put_uint32(pktout, h);
    put_uint32(pktout, w);
    put_uint32(pktout, 0); /* width in pixels */
    put_uint32(pktout, 0); /* height in pixels */
    pq_push(s->ppl.out_pq, pktout);
}